

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::HDF5OutputParameter::MergePartialFromCodedStream
          (HDF5OutputParameter *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  bool bVar4;
  uint32 uVar5;
  int iVar6;
  UnknownFieldSet *unknown_fields;
  uint tag;
  ulong uVar7;
  
  this_00 = &this->file_name_;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003afb70;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003afb70:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar7 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar5 | uVar7;
    }
    tag = (uint)uVar7;
    if (((uVar7 & 0x100000000) == 0) || ((char)uVar7 != '\n' || (tag & 0xfffffff8) != 8)) {
      iVar6 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        pvVar3 = (this->_internal_metadata_).
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 .ptr_;
        if (((ulong)pvVar3 & 1) == 0) {
          unknown_fields =
               google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
        }
        else {
          unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
        }
        bVar4 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
        iVar6 = 6;
        if (bVar4) goto LAB_003afc28;
      }
    }
    else {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if ((this->file_name_).ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_00,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,this_00->ptr_);
      iVar6 = 6;
      if (bVar4) {
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                   "caffe.HDF5OutputParameter.file_name");
LAB_003afc28:
        iVar6 = 0;
      }
    }
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool HDF5OutputParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.HDF5OutputParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string file_name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_file_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->file_name().data(), this->file_name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.HDF5OutputParameter.file_name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.HDF5OutputParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.HDF5OutputParameter)
  return false;
#undef DO_
}